

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int whereLoopAddVirtual(WhereLoopBuilder *pBuilder,Bitmask mPrereq,Bitmask mUnusable)

{
  int *piVar1;
  byte bVar2;
  SrcList *pSVar3;
  ExprList *pEVar4;
  Expr *pEVar5;
  Bitmask BVar6;
  WhereLoop *pWVar7;
  int iVar8;
  uint extraout_EAX;
  sqlite3_index_info *pIdxInfo;
  ulong uVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  u8 uVar14;
  ushort uVar15;
  ulong uVar16;
  ExprList_item *pEVar17;
  WhereTerm *pWVar18;
  ulong uVar19;
  u16 *puVar20;
  WhereClause *pWVar21;
  ushort uVar22;
  uint uVar23;
  Select *pSVar24;
  ulong uVar25;
  uint uVar26;
  long lVar27;
  ulong uVar28;
  Parse *pParse;
  ulong uVar29;
  int bIn;
  int local_88;
  uint local_84;
  undefined8 local_80;
  uint local_74;
  WhereLoopBuilder *local_70;
  Bitmask local_68;
  WhereClause *local_60;
  ulong local_58;
  WhereLoop *local_50;
  ulong local_48;
  ulong local_40;
  Parse *local_38;
  
  local_60 = pBuilder->pWC;
  pSVar3 = pBuilder->pWInfo->pTabList;
  local_50 = pBuilder->pNew;
  bVar2 = local_50->iTab;
  local_80 = pSVar3->a + bVar2;
  pEVar4 = pBuilder->pOrderBy;
  iVar11 = local_60->nTerm;
  iVar8 = 0;
  if (0 < iVar11) {
    puVar20 = &local_60->a->eOperator;
    iVar8 = 0;
    do {
      if ((*(int *)(puVar20 + 4) == pSVar3->a[bVar2].iCursor) &&
         ((*(ulong *)(puVar20 + 0xe) & mUnusable) == 0)) {
        iVar8 = (iVar8 + 1) - (uint)((*puVar20 & 0xf7ff) == 0);
      }
      puVar20 = puVar20 + 0x20;
      iVar11 = iVar11 + -1;
    } while (iVar11 != 0);
  }
  pParse = pBuilder->pWInfo->pParse;
  uVar26 = 0;
  if (pEVar4 != (ExprList *)0x0) {
    uVar10 = pEVar4->nExpr;
    uVar12 = 0;
    if (0 < (int)uVar10) {
      pEVar17 = pEVar4->a;
      uVar12 = 0;
      do {
        if ((pEVar17->pExpr->op != 0x9e) || (pEVar17->pExpr->iTable != pSVar3->a[bVar2].iCursor))
        goto LAB_00180ec5;
        uVar12 = uVar12 + 1;
        pEVar17 = pEVar17 + 1;
      } while (uVar10 != uVar12);
      uVar12 = (ulong)uVar10;
    }
LAB_00180ec5:
    uVar26 = 0;
    if ((uint)uVar12 == uVar10) {
      uVar26 = uVar10;
    }
  }
  lVar27 = (long)iVar8;
  local_58 = CONCAT44(local_58._4_4_,uVar26);
  local_70 = pBuilder;
  local_68 = mPrereq;
  pIdxInfo = (sqlite3_index_info *)
             sqlite3DbMallocZero(pParse->db,(long)(int)uVar26 * 8 + lVar27 * 0x14 + 0x70);
  local_38 = pParse;
  if (pIdxInfo == (sqlite3_index_info *)0x0) {
    pIdxInfo = (sqlite3_index_info *)0x0;
    sqlite3ErrorMsg(pParse,"out of memory");
    local_84 = extraout_EAX;
  }
  else {
    pIdxInfo->nConstraint = iVar8;
    pIdxInfo->nOrderBy = uVar26;
    pIdxInfo->aConstraint = (sqlite3_index_constraint *)&pIdxInfo[1].nOrderBy;
    pIdxInfo->aOrderBy = (sqlite3_index_orderby *)(&pIdxInfo[1].nOrderBy + lVar27 * 3);
    pIdxInfo->aConstraintUsage =
         (sqlite3_index_constraint_usage *)
         ((sqlite3_index_orderby *)(&pIdxInfo[1].nOrderBy + lVar27 * 3) + (int)uVar26);
    *(WhereClause **)(pIdxInfo + 1) = local_60;
    pIdxInfo[1].aConstraint = (sqlite3_index_constraint *)pParse;
    uVar26 = local_60->nTerm;
    if ((int)uVar26 < 1) {
      local_84 = 0;
    }
    else {
      pWVar18 = local_60->a;
      iVar11 = local_80->iCursor;
      uVar10 = 0;
      iVar8 = 0;
      local_84 = 0;
      do {
        if ((((pWVar18->leftCursor == iVar11) && ((pWVar18->prereqRight & mUnusable) == 0)) &&
            (uVar15 = pWVar18->eOperator, (uVar15 & 0xf7ff) != 0)) &&
           (((((local_80->fg).jointype & 8) == 0 || ((uVar15 & 0x180) == 0)) ||
            ((pWVar18->pExpr->flags & 1) != 0)))) {
          piVar1 = &pIdxInfo[1].nOrderBy + (long)iVar8 * 3;
          *piVar1 = (pWVar18->u).leftColumn;
          piVar1[2] = uVar10;
          uVar15 = uVar15 & 0x1fff;
          uVar22 = uVar15;
          if (uVar15 == 1) {
            uVar22 = 2;
          }
          if (uVar22 == 0x40) {
            uVar14 = pWVar18->eMatchOp;
LAB_00181008:
            *(u8 *)(piVar1 + 1) = uVar14;
          }
          else {
            if ((uVar22 & 0x180) != 0) {
              uVar14 = 'H' - (uVar22 == 0x100);
              goto LAB_00181008;
            }
            *(char *)(piVar1 + 1) = (char)uVar22;
            if ((uVar22 & 0x3c) != 0) {
              pEVar5 = pWVar18->pExpr->pRight;
              uVar14 = pEVar5->op;
              if (uVar14 == 0xa4) {
                uVar14 = pEVar5->op2;
              }
              if (uVar14 == '\x7f') {
                pSVar24 = (pEVar5->x).pSelect;
              }
              else {
                if (uVar14 != 0xa5) goto LAB_0018100d;
                pSVar24 = (Select *)&pEVar5->x;
              }
              if (1 < ((anon_union_8_2_a01b6dbf_for_x *)&pSVar24->pEList)->pList->nExpr) {
                uVar23 = 1 << ((byte)uVar10 & 0x1f);
                if (0xf < uVar10) {
                  uVar23 = 0;
                }
                local_84 = local_84 | uVar23;
                if (uVar15 == 0x10) {
                  uVar14 = '\b';
                }
                else {
                  if (uVar15 != 4) goto LAB_0018100d;
                  uVar14 = ' ';
                }
                goto LAB_00181008;
              }
            }
          }
LAB_0018100d:
          iVar8 = iVar8 + 1;
        }
        uVar10 = uVar10 + 1;
        pWVar18 = pWVar18 + 1;
      } while (uVar26 != uVar10);
    }
    if (0 < (int)local_58) {
      lVar13 = 0;
      do {
        *(int *)((long)&pIdxInfo[1].nOrderBy + lVar13 + lVar27 * 0xc) =
             (int)*(short *)(*(long *)((long)&pEVar4->a[0].pExpr + lVar13 * 4) + 0x30);
        (&pIdxInfo[1].field_0x14)[lVar13 + lVar27 * 0xc] = (&pEVar4->a[0].sortOrder)[lVar13 * 4];
        lVar13 = lVar13 + 8;
      } while ((local_58 & 0xffffffff) << 3 != lVar13);
    }
  }
  pWVar7 = local_50;
  if (pIdxInfo == (sqlite3_index_info *)0x0) {
    iVar11 = 7;
  }
  else {
    local_50->rSetup = 0;
    local_50->wsFlags = 0x400;
    local_50->nLTerm = 0;
    (local_50->u).vtab.needFree = '\0';
    uVar12 = (ulong)(uint)pIdxInfo->nConstraint;
    iVar8 = whereLoopResize(pParse->db,local_50,pIdxInfo->nConstraint);
    BVar6 = local_68;
    iVar11 = 7;
    if (iVar8 == 0) {
      local_80 = (SrcList_item *)(CONCAT44(local_80._4_4_,local_84) & 0xffffffff0000ffff);
      iVar11 = whereLoopAddVirtualOne
                         (local_70,local_68,0xffffffffffffffff,0,pIdxInfo,(u16)local_84,&local_88);
      if (iVar11 == 0) {
        uVar29 = ~BVar6;
        iVar11 = 0;
        uVar25 = pWVar7->prereq & uVar29;
        if (uVar25 != 0) {
          if (local_88 == 0) {
            iVar11 = 0;
            uVar26 = 0;
            local_58 = 0;
          }
          else {
            iVar11 = whereLoopAddVirtualOne
                               (local_70,local_68,0xffffffffffffffff,1,pIdxInfo,(u16)local_80,
                                &local_88);
            local_58 = pWVar7->prereq & uVar29;
            uVar26 = (uint)(local_58 == 0);
          }
          lVar27 = uVar12 * 0xc;
          pWVar21 = local_60;
          uVar28 = 0;
          local_74 = uVar26;
          local_48 = uVar25;
          local_40 = uVar12;
          do {
            BVar6 = local_68;
            if (iVar11 != 0) break;
            if ((int)uVar12 < 1) {
              uVar9 = 0xffffffffffffffff;
            }
            else {
              uVar9 = 0xffffffffffffffff;
              lVar13 = 0;
              do {
                uVar16 = pWVar21->a[*(int *)((long)&pIdxInfo->aConstraint->iTermOffset + lVar13)].
                         prereqRight & uVar29;
                uVar19 = uVar9;
                if (uVar16 < uVar9) {
                  uVar19 = uVar16;
                }
                if (uVar28 < uVar16) {
                  uVar9 = uVar19;
                }
                lVar13 = lVar13 + 0xc;
              } while (lVar27 != lVar13);
            }
            iVar11 = 0;
            if (((uVar9 != 0xffffffffffffffff) && (uVar9 != uVar25)) &&
               ((iVar11 = 0, uVar9 != local_58 &&
                ((local_84 = uVar26,
                 iVar11 = whereLoopAddVirtualOne
                                    (local_70,local_68,uVar9 | local_68,0,pIdxInfo,(u16)local_80,
                                     &local_88), uVar12 = local_40, pWVar21 = local_60,
                 uVar25 = local_48, uVar26 = local_84, local_50->prereq == BVar6 &&
                 (uVar26 = 1, local_88 == 0)))))) {
              local_74 = 1;
            }
            uVar28 = uVar9;
          } while (uVar9 != 0xffffffffffffffff);
          pParse = local_38;
          uVar10 = local_74;
          if (uVar26 == 0 && iVar11 == 0) {
            iVar11 = whereLoopAddVirtualOne
                               (local_70,local_68,local_68,0,pIdxInfo,(u16)local_80,&local_88);
            uVar10 = local_74;
            if (local_88 == 0) {
              uVar10 = 1;
            }
          }
          if (uVar10 == 0 && iVar11 == 0) {
            iVar11 = whereLoopAddVirtualOne
                               (local_70,local_68,local_68,1,pIdxInfo,(u16)local_80,&local_88);
          }
        }
      }
      if (pIdxInfo->needToFreeIdxStr != 0) {
        sqlite3_free(pIdxInfo->idxStr);
      }
    }
    sqlite3DbFreeNN(pParse->db,pIdxInfo);
  }
  return iVar11;
}

Assistant:

static int whereLoopAddVirtual(
  WhereLoopBuilder *pBuilder,  /* WHERE clause information */
  Bitmask mPrereq,             /* Tables that must be scanned before this one */
  Bitmask mUnusable            /* Tables that must be scanned after this one */
){
  int rc = SQLITE_OK;          /* Return code */
  WhereInfo *pWInfo;           /* WHERE analysis context */
  Parse *pParse;               /* The parsing context */
  WhereClause *pWC;            /* The WHERE clause */
  struct SrcList_item *pSrc;   /* The FROM clause term to search */
  sqlite3_index_info *p;       /* Object to pass to xBestIndex() */
  int nConstraint;             /* Number of constraints in p */
  int bIn;                     /* True if plan uses IN(...) operator */
  WhereLoop *pNew;
  Bitmask mBest;               /* Tables used by best possible plan */
  u16 mNoOmit;

  assert( (mPrereq & mUnusable)==0 );
  pWInfo = pBuilder->pWInfo;
  pParse = pWInfo->pParse;
  pWC = pBuilder->pWC;
  pNew = pBuilder->pNew;
  pSrc = &pWInfo->pTabList->a[pNew->iTab];
  assert( IsVirtual(pSrc->pTab) );
  p = allocateIndexInfo(pParse, pWC, mUnusable, pSrc, pBuilder->pOrderBy, 
      &mNoOmit);
  if( p==0 ) return SQLITE_NOMEM_BKPT;
  pNew->rSetup = 0;
  pNew->wsFlags = WHERE_VIRTUALTABLE;
  pNew->nLTerm = 0;
  pNew->u.vtab.needFree = 0;
  nConstraint = p->nConstraint;
  if( whereLoopResize(pParse->db, pNew, nConstraint) ){
    sqlite3DbFree(pParse->db, p);
    return SQLITE_NOMEM_BKPT;
  }

  /* First call xBestIndex() with all constraints usable. */
  WHERETRACE(0x800, ("BEGIN %s.addVirtual()\n", pSrc->pTab->zName));
  WHERETRACE(0x40, ("  VirtualOne: all usable\n"));
  rc = whereLoopAddVirtualOne(pBuilder, mPrereq, ALLBITS, 0, p, mNoOmit, &bIn);

  /* If the call to xBestIndex() with all terms enabled produced a plan
  ** that does not require any source tables (IOW: a plan with mBest==0),
  ** then there is no point in making any further calls to xBestIndex() 
  ** since they will all return the same result (if the xBestIndex()
  ** implementation is sane). */
  if( rc==SQLITE_OK && (mBest = (pNew->prereq & ~mPrereq))!=0 ){
    int seenZero = 0;             /* True if a plan with no prereqs seen */
    int seenZeroNoIN = 0;         /* Plan with no prereqs and no IN(...) seen */
    Bitmask mPrev = 0;
    Bitmask mBestNoIn = 0;

    /* If the plan produced by the earlier call uses an IN(...) term, call
    ** xBestIndex again, this time with IN(...) terms disabled. */
    if( bIn ){
      WHERETRACE(0x40, ("  VirtualOne: all usable w/o IN\n"));
      rc = whereLoopAddVirtualOne(
          pBuilder, mPrereq, ALLBITS, WO_IN, p, mNoOmit, &bIn);
      assert( bIn==0 );
      mBestNoIn = pNew->prereq & ~mPrereq;
      if( mBestNoIn==0 ){
        seenZero = 1;
        seenZeroNoIN = 1;
      }
    }

    /* Call xBestIndex once for each distinct value of (prereqRight & ~mPrereq) 
    ** in the set of terms that apply to the current virtual table.  */
    while( rc==SQLITE_OK ){
      int i;
      Bitmask mNext = ALLBITS;
      assert( mNext>0 );
      for(i=0; i<nConstraint; i++){
        Bitmask mThis = (
            pWC->a[p->aConstraint[i].iTermOffset].prereqRight & ~mPrereq
        );
        if( mThis>mPrev && mThis<mNext ) mNext = mThis;
      }
      mPrev = mNext;
      if( mNext==ALLBITS ) break;
      if( mNext==mBest || mNext==mBestNoIn ) continue;
      WHERETRACE(0x40, ("  VirtualOne: mPrev=%04llx mNext=%04llx\n",
                       (sqlite3_uint64)mPrev, (sqlite3_uint64)mNext));
      rc = whereLoopAddVirtualOne(
          pBuilder, mPrereq, mNext|mPrereq, 0, p, mNoOmit, &bIn);
      if( pNew->prereq==mPrereq ){
        seenZero = 1;
        if( bIn==0 ) seenZeroNoIN = 1;
      }
    }

    /* If the calls to xBestIndex() in the above loop did not find a plan
    ** that requires no source tables at all (i.e. one guaranteed to be
    ** usable), make a call here with all source tables disabled */
    if( rc==SQLITE_OK && seenZero==0 ){
      WHERETRACE(0x40, ("  VirtualOne: all disabled\n"));
      rc = whereLoopAddVirtualOne(
          pBuilder, mPrereq, mPrereq, 0, p, mNoOmit, &bIn);
      if( bIn==0 ) seenZeroNoIN = 1;
    }

    /* If the calls to xBestIndex() have so far failed to find a plan
    ** that requires no source tables at all and does not use an IN(...)
    ** operator, make a final call to obtain one here.  */
    if( rc==SQLITE_OK && seenZeroNoIN==0 ){
      WHERETRACE(0x40, ("  VirtualOne: all disabled and w/o IN\n"));
      rc = whereLoopAddVirtualOne(
          pBuilder, mPrereq, mPrereq, WO_IN, p, mNoOmit, &bIn);
    }
  }

  if( p->needToFreeIdxStr ) sqlite3_free(p->idxStr);
  sqlite3DbFreeNN(pParse->db, p);
  WHERETRACE(0x800, ("END %s.addVirtual(), rc=%d\n", pSrc->pTab->zName, rc));
  return rc;
}